

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

void libcmselect_LTX_remove_select(CMtrans_services svc,select_data_ptr *sdp,int fd)

{
  int in_EDX;
  CManager_conflict in_RSI;
  select_data_ptr *in_RDI;
  CMtrans_services unaff_retaddr;
  select_data_ptr sd;
  transport_entry_conflict *local_20;
  
  local_20 = in_RSI->transports;
  if (local_20 == (transport_entry_conflict *)0x0) {
    init_select_data(unaff_retaddr,in_RDI,in_RSI);
    local_20 = in_RSI->transports;
  }
  *(int *)(local_20 + 9) = *(int *)(local_20 + 9) + 1;
  (&local_20[1]->trans_name)[in_EDX / 0x40] =
       (char *)((1L << ((byte)((long)in_EDX % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
               (ulong)(&local_20[1]->trans_name)[in_EDX / 0x40]);
  (&local_20[4]->trans_name)[(long)in_EDX * 3] = (char *)0x0;
  (&local_20[4]->cm)[(long)in_EDX * 3] = (CManager)0x0;
  (&local_20[4]->dlhandle)[(long)in_EDX * 3] = (void *)0x0;
  wake_server_thread((select_data_ptr)0x1022c7);
  return;
}

Assistant:

extern void
libcmselect_LTX_remove_select(CMtrans_services svc, select_data_ptr *sdp, int fd)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    FD_CLR(fd, (fd_set *) sd->fdset);
    sd->select_items[fd].func = NULL;
    sd->select_items[fd].arg1 = NULL;
    sd->select_items[fd].arg2 = NULL;
    wake_server_thread(sd);
}